

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlsave(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  xmlDocPtr pxVar13;
  xmlNodePtr val;
  int nr;
  int test_ret;
  int iVar14;
  int iVar15;
  int n_doc;
  uint uVar16;
  xmlDocPtr in_RSI;
  undefined4 uVar17;
  undefined8 uVar18;
  int test_ret_2;
  undefined8 *puVar19;
  int test_ret_1;
  undefined4 *puVar20;
  
  if (quiet == '\0') {
    puts("Testing xmlsave : 9 of 15 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlSaveClose(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveClose");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar16 = 0;
  iVar14 = 0;
  do {
    iVar4 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    pxVar13 = gen_xmlDocPtr(uVar16,iVar4);
    in_RSI = pxVar13;
    xmlSaveDoc(0);
    call_tests = call_tests + 1;
    if (((pxVar13 != (xmlDocPtr)0x0) && (api_doc != pxVar13)) && (pxVar13->doc != api_doc)) {
      xmlFreeDoc(pxVar13);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSaveDoc",(ulong)(uint)(iVar4 - iVar3));
      iVar14 = iVar14 + 1;
      printf(" %d",0);
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 4);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlSaveFinish(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveFinish");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlSaveFlush(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveFlush");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar19 = &DAT_00159d48;
  uVar16 = 0;
  iVar15 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar16 < 3) {
      val = (xmlNodePtr)*puVar19;
    }
    else {
      val = (xmlNodePtr)0x0;
    }
    xmlSaveSetIndentString(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSaveSetIndentString",(ulong)(uint)(iVar8 - iVar7));
      iVar15 = iVar15 + 1;
      printf(" %d",0);
      val = (xmlNodePtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
    uVar16 = uVar16 + 1;
    puVar19 = puVar19 + 1;
  } while (uVar16 != 4);
  function_tests = function_tests + 1;
  uVar16 = 0;
  iVar7 = 0;
  do {
    iVar9 = (int)val;
    iVar8 = xmlMemBlocks();
    val = gen_xmlNodePtr(uVar16,iVar9);
    xmlSaveTree(0,val);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar16,val,nr);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSaveTree",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      val = (xmlNodePtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 3);
  function_tests = function_tests + 1;
  puVar20 = &DAT_00157254;
  uVar16 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    uVar17 = 0xffffffff;
    if (uVar16 < 4) {
      uVar17 = *puVar20;
    }
    xmlThrDefIndentTreeOutput(uVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefIndentTreeOutput",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d",(ulong)uVar16);
      putchar(10);
    }
    uVar16 = uVar16 + 1;
    puVar20 = puVar20 + 1;
  } while (uVar16 != 4);
  function_tests = function_tests + 1;
  puVar20 = &DAT_00157254;
  uVar16 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    uVar17 = 0xffffffff;
    if (uVar16 < 4) {
      uVar17 = *puVar20;
    }
    xmlThrDefSaveNoEmptyTags(uVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefSaveNoEmptyTags",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d",(ulong)uVar16);
      putchar(10);
    }
    uVar16 = uVar16 + 1;
    puVar20 = puVar20 + 1;
  } while (uVar16 != 4);
  function_tests = function_tests + 1;
  puVar19 = &DAT_00159d48;
  uVar16 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar16 < 3) {
      uVar18 = *puVar19;
    }
    else {
      uVar18 = 0;
    }
    xmlThrDefTreeIndentString(uVar18);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefTreeIndentString",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",(ulong)uVar16);
      putchar(10);
    }
    uVar16 = uVar16 + 1;
    puVar19 = puVar19 + 1;
  } while (uVar16 != 4);
  function_tests = function_tests + 1;
  uVar16 = iVar14 + (uint)(iVar1 != iVar2) + (uint)(iVar3 != iVar4) + (uint)(iVar5 != iVar6) +
           iVar15 + iVar7 + iVar8 + iVar9 + iVar10;
  if (uVar16 != 0) {
    printf("Module xmlsave: %d errors\n",(ulong)uVar16);
  }
  return uVar16;
}

Assistant:

static int
test_xmlsave(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlsave : 9 of 15 functions ...\n");
    test_ret += test_xmlSaveClose();
    test_ret += test_xmlSaveDoc();
    test_ret += test_xmlSaveFinish();
    test_ret += test_xmlSaveFlush();
    test_ret += test_xmlSaveSetAttrEscape();
    test_ret += test_xmlSaveSetEscape();
    test_ret += test_xmlSaveSetIndentString();
    test_ret += test_xmlSaveToBuffer();
    test_ret += test_xmlSaveToFd();
    test_ret += test_xmlSaveToFilename();
    test_ret += test_xmlSaveTree();
    test_ret += test_xmlThrDefIndentTreeOutput();
    test_ret += test_xmlThrDefSaveNoEmptyTags();
    test_ret += test_xmlThrDefTreeIndentString();

    if (test_ret != 0)
	printf("Module xmlsave: %d errors\n", test_ret);
    return(test_ret);
}